

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::DelayFilterOperation::DelayFilterOperation(DelayFilterOperation *this,Time delayTime)

{
  pointer p_Var1;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimeOperator,_std::allocator<helics::MessageTimeOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_60;
  __shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2> local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (this->super_FilterOperations)._vptr_FilterOperations =
       (_func_int **)&PTR__DelayFilterOperation_00446930;
  (this->delay)._M_i.internalTimeCode = delayTime.internalTimeCode;
  (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (delayTime.internalTimeCode < 0) {
    LOCK();
    (this->delay)._M_i.internalTimeCode = 0;
    UNLOCK();
  }
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimeOperator,_std::allocator<helics::MessageTimeOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00446da8;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:45:9)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FilterOperations.cpp:45:9)>
             ::_M_manager;
  local_60._M_alloc = &__a2;
  local_60._M_ptr = p_Var1;
  local_40._M_unused._M_object = this;
  MessageTimeOperator::MessageTimeOperator
            ((MessageTimeOperator *)&p_Var1->_M_impl,
             (function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)&local_40);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_60._M_ptr = (pointer)0x0;
  local_50._M_ptr = (element_type *)&p_Var1->_M_impl;
  local_50._M_refcount._M_pi = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimeOperator,_std::allocator<helics::MessageTimeOperator>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_60);
  std::__shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->td).super___shared_ptr<helics::MessageTimeOperator,_(__gnu_cxx::_Lock_policy)2>
             ,&local_50);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_refcount);
  return;
}

Assistant:

DelayFilterOperation::DelayFilterOperation(Time delayTime): delay(delayTime)
{
    if (delayTime < timeZero) {
        delay = timeZero;
    }
    td = std::make_shared<MessageTimeOperator>(
        [this](Time messageTime) { return messageTime + delay; });
}